

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

int __thiscall antlr::CharScanner::testLiteralsTable(CharScanner *this,int ttype)

{
  bool bVar1;
  reference ppVar2;
  int in_ESI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_RDI;
  const_iterator i;
  _Self local_20;
  _Self local_18;
  int local_c;
  
  local_c = in_ESI;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(in_RDI,(key_type *)0x14cd36);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(in_RDI);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                          *)0x14cd6c);
    local_c = ppVar2->second;
  }
  return local_c;
}

Assistant:

virtual int testLiteralsTable(int ttype) const
	{
		ANTLR_USE_NAMESPACE(std)map<ANTLR_USE_NAMESPACE(std)string,int,CharScannerLiteralsLess>::const_iterator i = literals.find(text);
		if (i != literals.end())
			ttype = (*i).second;
		return ttype;
	}